

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int cuddCollectNodes(DdNode *f,st__table *visited)

{
  int iVar1;
  int retval;
  DdNode *E;
  DdNode *T;
  st__table *visited_local;
  DdNode *f_local;
  
  iVar1 = st__lookup(visited,(char *)f,(char **)0x0);
  if (iVar1 == 1) {
    f_local._4_4_ = 1;
  }
  else if (f == (DdNode *)0x0) {
    f_local._4_4_ = 0;
  }
  else {
    iVar1 = st__add_direct(visited,(char *)f,(char *)0x0);
    if (iVar1 == -10000) {
      f_local._4_4_ = 0;
    }
    else if (f->index == 0x7fffffff) {
      f_local._4_4_ = 1;
    }
    else {
      f_local._4_4_ = cuddCollectNodes((f->type).kids.T,visited);
      if (f_local._4_4_ == 1) {
        f_local._4_4_ =
             cuddCollectNodes((DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe),visited);
      }
    }
  }
  return f_local._4_4_;
}

Assistant:

int
cuddCollectNodes(
  DdNode * f,
  st__table * visited)
{
    DdNode      *T, *E;
    int         retval;

#ifdef DD_DEBUG
    assert(!Cudd_IsComplement(f));
#endif

    /* If already visited, nothing to do. */
    if ( st__is_member(visited, (char *) f) == 1)
        return(1);

    /* Check for abnormal condition that should never happen. */
    if (f == NULL)
        return(0);

    /* Mark node as visited. */
    if ( st__add_direct(visited, (char *) f, NULL) == st__OUT_OF_MEM)
        return(0);

    /* Check terminal case. */
    if (cuddIsConstant(f))
        return(1);

    /* Recursive calls. */
    T = cuddT(f);
    retval = cuddCollectNodes(T,visited);
    if (retval != 1) return(retval);
    E = Cudd_Regular(cuddE(f));
    retval = cuddCollectNodes(E,visited);
    return(retval);

}